

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::DallasWaitIdle(AmpIO *this)

{
  bool bVar1;
  uint local_20;
  int local_1c;
  uint32_t status;
  int i;
  AmpIO *this_local;
  
  _status = this;
  for (local_1c = 0; local_1c < 2000; local_1c = local_1c + 1) {
    Amp1394_Sleep(0.001);
    bVar1 = DallasReadStatus(this,&local_20);
    if (!bVar1) {
      return false;
    }
    if ((local_20 & 0x20f0) == 0) break;
  }
  return local_1c < 2000;
}

Assistant:

bool AmpIO::DallasWaitIdle()
{
    int i;
    uint32_t status;
    // For each block (256 bytes), wait up to 2000 msec. The actual processing time varies according to system setting.
    // Based on measurements, direct 1-wire interface costs about 250-300 msec to read entire 2048 bytes.
    // For DS2480B serial method, the approximate read time is 5 sec.
    for (i = 0; i < 2000; i++) {
        // Wait 1 msec
        Amp1394_Sleep(0.001);
        if (!DallasReadStatus(status)) return false;
        // Done when in idle state. The following test works for both Firmware Rev 7
        // (state is bits 7:4) and Firmware Rev 8 (state is bits 8:4 and busy flag is bit 13)
        if ((status&0x000020F0) == 0)
            break;
    }
    //std::cerr << "Wait time = " << i << " milliseconds" << std::endl;
    return (i < 2000);
}